

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bool __thiscall
lzham::lzcompressor::extreme_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  vector<lzham::lzcompressor::lzdecision> *this_00;
  uint uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  dict_match *pdVar10;
  uint8 *puVar11;
  bit_cost_t bVar12;
  uint uVar13;
  ulong uVar14;
  lzdecision *plVar15;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  bit_cost_t *pbVar16;
  lzdecision *plVar17;
  node *pnVar18;
  uint uVar19;
  uint uVar20;
  uint *puVar21;
  uchar *puVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  state *psVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  lzdecision lzdec;
  uint match_distances [128];
  uint match_lens [128];
  bit_cost_t lzdec_bitcosts [258];
  uint local_d3c;
  uint local_d38;
  uint local_d34;
  uint local_d28;
  lzdecision local_d1c;
  uint local_d10;
  uint local_d0c;
  ulong local_d08;
  state *local_d00;
  node *local_cf8;
  search_accelerator *local_cf0;
  ulong local_ce8;
  bit_cost_t local_ce0;
  ulong local_cd8;
  ulong local_cd0;
  ulong local_cc8;
  ulong local_cc0;
  uint local_cb8;
  uint local_cb4;
  node *local_cb0;
  uint *local_ca8;
  ulong local_ca0;
  uchar *local_c98;
  lzcompressor *local_c90;
  node *local_c88;
  ulong local_c80;
  node *local_c78;
  node *local_c70;
  node_state *local_c68;
  ulong local_c60;
  long local_c58;
  ulong local_c50;
  uint auStack_c48 [128];
  uint auStack_a48 [128];
  bit_cost_t local_848 [259];
  long lVar31;
  
  (parse_state->super_raw_parse_thread_state).m_failed = false;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = true;
  auVar3 = _DAT_0011f070;
  local_cf8 = (parse_state->super_raw_parse_thread_state).m_nodes;
  lVar9 = 0x4c58;
  auVar30 = _DAT_0011f050;
  auVar32 = _DAT_0011f060;
  do {
    auVar33 = auVar32 ^ auVar3;
    if (auVar33._4_4_ == -0x80000000 && auVar33._0_4_ < -0x7ffff3ff) {
      *(undefined4 *)((long)parse_state + lVar9 + -0x2b8) = 0;
      *(undefined4 *)((long)parse_state + lVar9 + -0x1d0) = 0;
    }
    auVar33 = auVar30 ^ auVar3;
    if (auVar33._4_4_ == -0x80000000 && auVar33._0_4_ < -0x7ffff3ff) {
      *(undefined4 *)((long)parse_state + lVar9 + -0xe8) = 0;
      *(undefined4 *)
       ((long)(parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
              m_match_hist + lVar9 + -0x10) = 0;
    }
    lVar31 = auVar32._8_8_;
    auVar32._0_8_ = auVar32._0_8_ + 4;
    auVar32._8_8_ = lVar31 + 4;
    lVar31 = auVar30._8_8_;
    auVar30._0_8_ = auVar30._0_8_ + 4;
    auVar30._8_8_ = lVar31 + 4;
    lVar9 = lVar9 + 0x3a0;
  } while (lVar9 != 0xb2ff8);
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_num_node_states = 1;
  uVar6 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_state;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.m_cur_ofs =
       (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_ofs;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.m_cur_state
       = uVar6;
  uVar2 = *(undefined8 *)
           ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist
           + 2);
  *(undefined8 *)
   (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
   m_match_hist =
       *(undefined8 *)
        (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist;
  *(undefined8 *)
   ((parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
    m_match_hist + 2) = uVar2;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_parent_index = -1;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_parent_state_index = -1;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost = 0;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_complexity = 0;
  uVar28 = (ulong)(parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  if (uVar28 != 0) {
    psVar26 = &(parse_state->super_raw_parse_thread_state).m_approx_state;
    puVar21 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
              m_match_hist;
    uVar19 = (parse_state->super_raw_parse_thread_state).m_start_ofs;
    local_cf0 = &this->m_accel;
    local_d34 = uVar19 - ((this->m_accel).m_lookahead_pos & (this->m_accel).m_max_dict_size_mask);
    uVar14 = 0;
    local_d00 = psVar26;
    local_cb0 = local_cf8;
    local_ca8 = puVar21;
    local_c90 = this;
    local_c80 = uVar28;
    do {
      uVar28 = (ulong)uVar19;
      uVar23 = (int)local_c80 - (int)uVar14;
      uVar20 = 0x101;
      if (uVar23 < 0x101) {
        uVar20 = uVar23;
      }
      puVar22 = (this->m_accel).m_dict.m_p;
      local_d10 = 0;
      if (0 < (int)(uVar19 - (parse_state->super_raw_parse_thread_state).m_approx_state.
                             m_block_start_dict_ofs)) {
        local_d10 = (uint)puVar22[uVar19 - 1];
      }
      local_d0c = (this->m_accel).m_cur_dict_size + local_d34;
      uVar6 = 0;
      local_d3c = 0;
      local_d28 = 0;
      local_d08 = uVar14;
      if (1 < uVar23) {
        pdVar10 = search_accelerator::find_matches(local_cf0,local_d34,true);
        if (pdVar10 == (dict_match *)0x0) {
          local_d3c = 0;
          local_d28 = 0;
        }
        else {
          puVar11 = &pdVar10->m_len;
          local_d3c = 0;
          local_d28 = 0;
          do {
            uVar23 = *puVar11 + 2;
            if (uVar20 <= *puVar11 + 2) {
              uVar23 = uVar20;
            }
            uVar1 = ((dict_match *)(puVar11 + -4))->m_dist;
            if (local_d28 < uVar23) {
              auStack_a48[local_d3c] = uVar23;
              auStack_c48[local_d3c] = uVar1 & 0x7fffffff;
              local_d3c = local_d3c + 1;
              local_d28 = uVar23;
            }
            puVar11 = puVar11 + 5;
          } while (-1 < (int)uVar1);
        }
        uVar6 = search_accelerator::get_len2_match(local_cf0,local_d34);
      }
      pnVar18 = local_cf8 + local_d08;
      uVar14 = local_d08;
      local_cb4 = uVar6;
      if (pnVar18->m_num_node_states != 0) {
        local_c68 = pnVar18->m_node_states;
        local_cb8 = local_d10 >> 2;
        local_c78 = pnVar18 + 2;
        local_c70 = pnVar18 + 1;
        local_ca0 = (ulong)uVar20;
        local_ce8 = (ulong)local_d3c;
        local_c98 = puVar22 + uVar28;
        uVar27 = 0;
        local_cd0 = uVar28;
        local_c88 = pnVar18;
        do {
          if (uVar14 == 0) {
            uVar6 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                    m_cur_state;
          }
          else {
            (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_ofs =
                 local_c68[uVar27].m_saved_state.m_cur_ofs;
            uVar6 = local_c68[uVar27].m_saved_state.m_cur_state;
            (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_state
                 = uVar6;
            uVar2 = *(undefined8 *)(local_c68[uVar27].m_saved_state.m_match_hist + 2);
            *(undefined8 *)puVar21 = *(undefined8 *)local_c68[uVar27].m_saved_state.m_match_hist;
            *(undefined8 *)(puVar21 + 2) = uVar2;
          }
          uVar14 = (ulong)local_d0c;
          uVar6 = uVar6 * 0x40 + local_cb8;
          local_ce0 = local_c68[uVar27].m_total_cost;
          local_cc8 = (ulong)local_c68[uVar27].m_total_complexity;
          local_c60 = (ulong)(local_c68[uVar27].m_total_complexity + 2);
          uVar19 = 1;
          lVar9 = 0;
          local_d38 = 0;
          puVar22 = local_c98;
          uVar24 = local_ca0;
          local_cd8 = uVar27;
          do {
            if (puVar21[lVar9] <= (uint)uVar14) {
              uVar27 = 0;
              do {
                if ((this->m_accel).m_dict.m_p
                    [uVar27 + ((local_d34 - puVar21[lVar9]) + (this->m_accel).m_lookahead_pos &
                              (this->m_accel).m_max_dict_size_mask)] != puVar22[uVar27]) break;
                uVar27 = uVar27 + 1;
              } while (uVar27 < uVar24);
              uVar20 = (uint)uVar27;
              if (uVar19 <= uVar20) {
                uVar13 = (uint)lVar9;
                state::get_rep_match_costs
                          (psVar26,(uint)puVar22,local_848,uVar13,uVar19,uVar20,uVar6);
                uVar14 = local_cd8;
                bVar12 = local_ce0;
                uVar28 = local_d08;
                iVar7 = (int)local_c60;
                local_cc0 = CONCAT44(local_cc0._4_4_,~uVar13);
                local_c50 = uVar27 & 0xffffffff;
                pnVar18 = local_cb0 + uVar19;
                uVar27 = (ulong)uVar19;
                local_c58 = lVar9;
                do {
                  local_d1c.m_pos = (int)local_cd0;
                  local_d1c.m_dist = (int)local_cc0;
                  local_d1c.m_len = (int)uVar27;
                  node::add_state(pnVar18,(int)uVar28,(int)uVar14,&local_d1c,local_d00,
                                  local_848[uVar27] + bVar12,iVar7 + uVar13);
                  pnVar18 = pnVar18 + 1;
                  bVar29 = uVar27 < local_c50;
                  uVar27 = uVar27 + 1;
                } while (bVar29);
                if (local_d38 <= uVar20) {
                  local_d38 = uVar20;
                }
                uVar14 = (ulong)local_d0c;
                lVar9 = local_c58;
                puVar21 = local_ca8;
                puVar22 = local_c98;
                uVar24 = local_ca0;
                this = local_c90;
                psVar26 = local_d00;
                uVar28 = local_cd0;
              }
            }
            lVar9 = lVar9 + 1;
            uVar19 = 2;
          } while (lVar9 != 4);
          if (local_cb4 != 0) {
            local_d1c.m_pos = (int)uVar28;
            local_d1c.m_dist = local_cb4;
            local_d1c.m_len = 2;
            bVar12 = state::get_cost(psVar26,&this->super_CLZBase,local_cf0,&local_d1c);
            node::add_state(local_c78,(int)local_d08,(int)local_cd8,&local_d1c,psVar26,
                            bVar12 + local_ce0,(int)local_cc8 + 7);
            uVar14 = extraout_RDX;
            if (local_d38 < 3) {
              local_d38 = 2;
            }
          }
          if ((local_d38 < local_d28) && (local_d3c != 0)) {
            uVar19 = local_d38 + (local_d38 == 0);
            uVar28 = 0;
            uVar27 = local_ce8;
            do {
              uVar20 = auStack_a48[uVar28];
              if (local_d38 < uVar20) {
                uVar23 = uVar19 + 1;
                uVar13 = auStack_c48[uVar28];
                state::get_full_match_costs
                          (local_d00,&this->super_CLZBase,(uint)uVar14,local_848,uVar13,uVar23,
                           uVar20,uVar6);
                uVar4 = local_cc8;
                uVar24 = local_cd8;
                bVar12 = local_ce0;
                psVar26 = local_d00;
                uVar14 = extraout_RDX_00;
                uVar27 = local_ce8;
                for (; uVar19 = uVar20, local_ce8 = uVar27, uVar23 <= uVar20; uVar23 = uVar23 + 1) {
                  local_d1c.m_pos = (int)local_cd0;
                  local_d1c.m_dist = uVar13;
                  local_d1c.m_len = uVar23;
                  local_cc0 = uVar28;
                  node::add_state(local_c88 + uVar23,(int)local_d08,(int)uVar24,&local_d1c,psVar26,
                                  local_848[uVar23] + bVar12,(uVar23 < 9) + 6 + (int)uVar4);
                  uVar14 = extraout_RDX_01;
                  this = local_c90;
                  uVar28 = local_cc0;
                  uVar27 = local_ce8;
                }
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != uVar27);
          }
          uVar28 = local_cd0;
          psVar26 = local_d00;
          uVar19 = (uint)local_cd0;
          bVar12 = state::get_lit_cost(local_d00,local_cf0,uVar19,local_d10,uVar6);
          uVar27 = local_cd8;
          uVar14 = local_d08;
          local_d1c.m_len = 0;
          local_d1c.m_dist = 0;
          local_d1c.m_pos = uVar19;
          node::add_state(local_c70,(int)local_d08,(int)local_cd8,&local_d1c,psVar26,
                          local_ce0 + bVar12,(int)local_cc8 + 1);
          uVar27 = uVar27 + 1;
          puVar21 = local_ca8;
        } while (uVar27 < local_c88->m_num_node_states);
      }
      uVar19 = uVar19 + 1;
      local_d34 = local_d34 + 1;
      uVar14 = uVar14 + 1;
      local_cb0 = local_cb0 + 1;
      uVar28 = local_c80;
    } while (uVar14 != local_c80);
  }
  this_00 = &(parse_state->super_raw_parse_thread_state).m_best_decisions;
  bVar29 = elemental_vector::increase_capacity
                     ((elemental_vector *)this_00,(uint)uVar28,true,0xc,
                      vector<lzham::lzcompressor::lzdecision>::object_mover,true);
  if (bVar29) {
    if ((ulong)local_cf8[uVar28].m_num_node_states == 0) {
      uVar14 = 0;
    }
    else {
      pbVar16 = &(parse_state->super_raw_parse_thread_state).m_nodes[uVar28].m_node_states[0].
                 m_total_cost;
      uVar27 = 0xffffffffffffffff;
      uVar24 = 0;
      uVar14 = 0;
      do {
        if (*pbVar16 < uVar27) {
          uVar14 = uVar24 & 0xffffffff;
          uVar27 = *pbVar16;
        }
        uVar24 = uVar24 + 1;
        pbVar16 = pbVar16 + 7;
      } while (local_cf8[uVar28].m_num_node_states != uVar24);
    }
    plVar15 = this_00->m_p;
    plVar17 = plVar15;
    do {
      iVar25 = (int)uVar28;
      iVar8 = (int)uVar14;
      plVar17->m_dist = local_cf8[iVar25].m_node_states[iVar8].m_lzdec.m_dist;
      iVar7 = local_cf8[iVar25].m_node_states[iVar8].m_lzdec.m_len;
      plVar17->m_pos = local_cf8[iVar25].m_node_states[iVar8].m_lzdec.m_pos;
      plVar17->m_len = iVar7;
      plVar17 = plVar17 + 1;
      uVar19 = (uint)local_cf8[iVar25].m_node_states[iVar8].m_parent_index;
      uVar28 = (ulong)uVar19;
      plVar15 = plVar15 + 1;
      uVar14 = (ulong)(uint)(int)local_cf8[iVar25].m_node_states[iVar8].m_parent_state_index;
    } while (0 < (int)uVar19);
    uVar20 = (int)((ulong)((long)plVar15 -
                          (long)(parse_state->super_raw_parse_thread_state).m_best_decisions.m_p) >>
                  2) * -0x55555555;
    uVar19 = (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size;
    if ((uVar19 != uVar20) &&
       (((uVar20 < uVar19 ||
         (uVar20 <= (parse_state->super_raw_parse_thread_state).m_best_decisions.m_capacity)) ||
        (bVar5 = elemental_vector::increase_capacity
                           ((elemental_vector *)this_00,uVar20,uVar19 + 1 == uVar20,0xc,
                            vector<lzham::lzcompressor::lzdecision>::object_mover,true), bVar5)))) {
      (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size = uVar20;
    }
  }
  else {
    (parse_state->super_raw_parse_thread_state).m_failed = true;
  }
  return bVar29;
}

Assistant:

bool lzcompressor::extreme_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node *pNodes = parse_state.m_nodes;
      for (uint i = 0; i <= cMaxParseGraphNodes; i++)
      {
         pNodes[i].clear();
      }

      state &approx_state = parse_state.m_approx_state;

      pNodes[0].m_num_node_states = 1;
      node_state &first_node_state = pNodes[0].m_node_states[0];
      approx_state.save_partial_state(first_node_state.m_saved_state);
      first_node_state.m_parent_index = -1;
      first_node_state.m_parent_state_index = -1;
      first_node_state.m_total_cost = 0;
      first_node_state.m_total_complexity = 0;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      node prev_lit_node;
      prev_lit_node.clear();

      while (cur_node_index < bytes_to_parse)
      {
         node* pCur_node = &pNodes[cur_node_index];

         const uint max_admissable_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.get_cur_dict_size() + cur_lookahead_ofs;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // full matches
         uint max_full_match_len = 0;
         uint num_full_matches = 0;
         uint len2_match_dist = 0;

         if (max_admissable_match_len >= cMinMatchLen)
         {
            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_full_match_len)
                  {
                     max_full_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
         }

         for (uint cur_node_state_index = 0; cur_node_state_index < pCur_node->m_num_node_states; cur_node_state_index++)
         {
            node_state &cur_node_state = pCur_node->m_node_states[cur_node_state_index];

            if (cur_node_index)
            {
               LZHAM_ASSERT(cur_node_state.m_parent_index >= 0);

               approx_state.restore_partial_state(cur_node_state.m_saved_state);
            }

            uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, approx_state.m_cur_state);

            const bit_cost_t cur_node_total_cost = cur_node_state.m_total_cost;
            const uint cur_node_total_complexity = cur_node_state.m_total_complexity;

            // rep matches
            uint match_hist_max_len = 0;
            uint match_hist_min_match_len = 1;
            for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
            {
               uint hist_match_len = 0;

               uint dist = approx_state.m_match_hist[rep_match_index];
               if (dist <= find_dict_size)
               {
                  const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
                  const uint8* pComp = &m_accel.m_dict[comp_pos];

                  for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                     if (pComp[hist_match_len] != pLookahead[hist_match_len])
                        break;
               }

               if (hist_match_len >= match_hist_min_match_len)
               {
                  match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

                  approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

                  uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
                  for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
                  {
#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node& dst_node = pCur_node[l];

                     bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                     dst_node.add_state(cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, l, -((int)rep_match_index + 1)), approx_state, rep_match_total_cost, rep_match_total_complexity);
                  }
               }

               match_hist_min_match_len = cMinMatchLen;
            }

            uint min_truncate_match_len = match_hist_max_len;

            // nearest len2 match
            if (len2_match_dist)
            {
               lzdecision lzdec(cur_dict_ofs, 2, len2_match_dist);
               bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, lzdec);
               pCur_node[2].add_state(cur_node_index, cur_node_state_index, lzdec, approx_state, cur_node_total_cost + actual_cost, cur_node_total_complexity + cShortMatchComplexity);

               min_truncate_match_len = LZHAM_MAX(min_truncate_match_len, 2);
            }

            // full matches
            if (max_full_match_len > min_truncate_match_len)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint end_len = match_lens[full_match_index];
                  if (end_len <= min_truncate_match_len)
                     continue;

                  uint start_len = prev_max_match_len + 1;
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     dst_node.add_state( cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, l, match_dist), approx_state, match_total_cost, match_total_complexity);
                  }

                  prev_max_match_len = end_len;
               }
            }

            // literal
            bit_cost_t lit_cost = approx_state.get_lit_cost(m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
            bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
            uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
            {
               lzdecision actual_dec(cur_dict_ofs, 0, 0);
               bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
               LZHAM_ASSERT(actual_cost == lit_cost);
            }
#endif

            pCur_node[1].add_state( cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, 0, 0), approx_state, lit_total_cost, lit_total_complexity);

         } // cur_node_state_index

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;
      }

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_to_parse))
      {
         parse_state.m_failed = true;
         return false;
      }

      bit_cost_t lowest_final_cost = cBitCostMax; //math::cNearlyInfinite;
      int node_state_index = 0;
      node_state *pLast_node_states = pNodes[bytes_to_parse].m_node_states;
      for (uint i = 0; i < pNodes[bytes_to_parse].m_num_node_states; i++)
      {
         if (pLast_node_states[i].m_total_cost < lowest_final_cost)
         {
            lowest_final_cost = pLast_node_states[i].m_total_cost;
            node_state_index = i;
         }
      }

      int node_index = bytes_to_parse;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));

         node& cur_node = pNodes[node_index];
         const node_state &cur_node_state = cur_node.m_node_states[node_state_index];

         *pDst_dec++ = cur_node_state.m_lzdec;

         node_index = cur_node_state.m_parent_index;
         node_state_index = cur_node_state.m_parent_state_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      return true;
   }